

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyPort.hpp
# Opt level: O2

bool empty_port::impl<(empty_port::Kind)0>::
     wait_port_impl<std::chrono::duration<long,std::ratio<1l,1000l>>>
               (port_t port,char *host,duration<long,_std::ratio<1L,_1000L>_> max_wait)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  do {
    bVar1 = check_port_impl(port,host);
    if (!bVar1) break;
    local_30.__r = 1;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_30);
    lVar3 = std::chrono::_V2::system_clock::now();
  } while (lVar3 < max_wait.__r * 1000000 + lVar2);
  return !bVar1;
}

Assistant:

inline bool impl<TCP>::wait_port_impl(const port_t port, const char *host,
                                      D max_wait) {
    auto stop_at = clock_t::now() + max_wait;
    do {
        if (!impl<TCP>::check_port_impl(port, host)) {
            return true;
        }
        std::this_thread::sleep_for(D(1));
    } while (clock_t::now() < stop_at);

    return false;
}